

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chests.c
# Opt level: O0

void no_chest_shuffle(dw_rom *rom)

{
  BOOL BVar1;
  uint8_t local_53 [3];
  uint8_t **ppuStack_50;
  uint8_t search_items [3];
  uint8_t *cont;
  uint8_t contents [29];
  dw_chest *local_20;
  dw_chest *chest;
  size_t i;
  dw_rom *rom_local;
  
  cont = (uint8_t *)0x1206041212121212;
  builtin_memcpy(contents,
                 "\x02\x04\x02\x12\x06\x03\f\x02\x0f\x02\x12\x12\f\r\x11\x0e\x04\t\x12\x02\a",0x15);
  ppuStack_50 = &cont;
  local_53[0] = '\n';
  local_53[1] = '\b';
  local_53[2] = 1;
  if (((rom->flags[9] & 0x30) != 0) || ((rom->flags[8] & 3) != 0)) {
    contents[0x14] = '\n';
    local_53[0] = '\0';
    local_53[1] = '\b';
  }
  rewrite_search_take_code(rom,local_53);
  local_20 = rom->chests;
  for (chest = (dw_chest *)0x0; chest < (dw_chest *)0x1f; chest = (dw_chest *)&chest->x) {
    BVar1 = is_static_chest(local_20);
    if (BVar1 == FALSE) {
      local_20->item = *(uint8_t *)ppuStack_50;
      ppuStack_50 = (uint8_t **)((long)ppuStack_50 + 1);
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

static void no_chest_shuffle(dw_rom *rom)
{
    size_t i;
    dw_chest *chest;
    uint8_t contents[] = {
            /* Tantegel */
            GOLD, GOLD, GOLD, GOLD, GOLD, TORCH,
            /* Rimuldar */
            WINGS,
            /* Garinham */
            GOLD, HERB, TORCH,
            /* Charlock Throne */
            HERB, GOLD, WINGS, KEY, CURSED_BELT, HERB,
            /* Tantegel basement */
            STONES,
            /* Garin's Grave */
            HERB, GOLD, GOLD, CURSED_BELT, HARP,
            /* Charlock dungeon */
            SWORD,
            /* Mountain Cave */
            NECKLACE, TORCH, RING, GOLD, HERB,
            /* Tablet cave (there is no longer a tablet in the game) */
            DRAGON_SCALE
    }, *cont = contents;
    uint8_t  search_items[] = {
           TOKEN, FLUTE, ARMOR
    };
    if (NO_NUMBERS(rom) || THREES_COMPANY(rom)) {
        contents[28] = TOKEN;
        search_items[0] = 0;
    }

    rewrite_search_take_code(rom, search_items);
    chest = rom->chests;
    for (i=0; i < CHEST_COUNT; i++) {
        /* don't move the staff or starting key */
        if (is_static_chest(chest)) {
            chest++;
            continue;
        }
        (chest++)->item = *(cont++);
    }
}